

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex frameIndex,MatrixView<double> *outJacobianPattern)

{
  long lVar1;
  pointer peVar2;
  char cVar3;
  uint uVar4;
  size_t r;
  long lVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *pDVar9;
  pointer peVar10;
  size_t c;
  ulong uVar11;
  pointer peVar12;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *pDVar13;
  pointer peVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  undefined1 local_228 [16];
  undefined8 local_218;
  MatrixFixSize<6U,_6U> *local_210;
  variable_if_dynamic<long,__1> local_208;
  variable_if_dynamic<long,__1> local_200;
  variable_if_dynamic<long,__1> vStack_1f8;
  variable_if_dynamic<long,__1> local_1f0;
  variable_if_dynamic<long,__1> local_1e8;
  variable_if_dynamic<long,__1> local_1e0;
  pointer local_1d8;
  Matrix6x6 *local_1d0 [2];
  Matrix<double,_6,_1,_0,_6,_1> *local_1c0;
  Matrix<double,_6,_1,_0,_6,_1> local_1b8;
  SpatialMotionVector jointMotionSubspace;
  Matrix6x6 genericAdjointTransform;
  
  cVar3 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
  if (cVar3 == '\0') {
    pcVar17 = "getFrameJacobian";
    pcVar15 = "Frame index out of bounds";
  }
  else {
    if ((outJacobianPattern->m_rows == 6) &&
       (lVar6 = outJacobianPattern->m_cols, lVar5 = iDynTree::Model::getNrOfDOFs(),
       lVar6 == lVar5 + 6)) {
      lVar6 = iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
      MatrixFixSize<6U,_6U>::zero(&genericAdjointTransform);
      local_228._8_8_ = 3;
      local_218 = (pointer)0x3;
      local_200.m_value = 0;
      vStack_1f8.m_value = 0;
      local_1f0.m_value = 6;
      local_228._0_8_ = &genericAdjointTransform;
      local_210 = &genericAdjointTransform;
      Eigen::
      DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
      ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                 *)local_228);
      local_228._0_8_ = genericAdjointTransform.m_data + 3;
      local_228._8_8_ = 3;
      local_218 = (pointer)0x3;
      local_200.m_value = 0;
      vStack_1f8.m_value = 3;
      local_1f0.m_value = 6;
      local_210 = &genericAdjointTransform;
      Eigen::
      DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
      ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                 *)local_228);
      local_228._0_8_ = genericAdjointTransform.m_data + 0x15;
      local_228._8_8_ = 3;
      local_218 = (pointer)0x3;
      local_200.m_value = 3;
      vStack_1f8.m_value = 3;
      local_1f0.m_value = 6;
      local_210 = &genericAdjointTransform;
      Eigen::
      DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
      ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                 *)local_228);
      bVar18 = outJacobianPattern->m_storageOrder == ColumnMajor;
      local_218 = (pointer)outJacobianPattern->m_cols;
      local_228._8_8_ = outJacobianPattern->m_rows;
      peVar2 = (pointer)0x1;
      local_208.m_value = (long)peVar2;
      if (bVar18) {
        local_208.m_value = local_228._8_8_;
      }
      local_228._0_8_ = outJacobianPattern->m_storage;
      local_210 = (MatrixFixSize<6U,_6U> *)local_218;
      if (bVar18) {
        local_210 = (MatrixFixSize<6U,_6U> *)peVar2;
      }
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>::
      setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
               *)local_228);
      bVar18 = outJacobianPattern->m_storageOrder == ColumnMajor;
      jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
      super_Vector3.m_data[2] = (double)outJacobianPattern->m_cols;
      jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
      super_Vector3.m_data[0] = (double)outJacobianPattern->m_storage;
      jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
      super_Vector3.m_data[1] = (double)outJacobianPattern->m_rows;
      jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.
      super_Vector3.m_data[1] = (double)peVar2;
      if (bVar18) {
        jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.
        super_Vector3.m_data[1] =
             jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
             super_Vector3.m_data[1];
      }
      jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.
      super_Vector3.m_data[0] =
           jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
           super_Vector3.m_data[2];
      if (bVar18) {
        jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.
        super_Vector3.m_data[0] = (double)peVar2;
      }
      local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)&genericAdjointTransform;
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>::
      leftCols<6>((Type *)local_228,
                  (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                   *)&jointMotionSubspace,6);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,_1,6,false>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>
                ((Type *)local_228,
                 (Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)&local_1b8);
      while( true ) {
        lVar5 = lVar6;
        iDynTree::Traversal::getBaseLink();
        lVar6 = iDynTree::Link::getIndex();
        if (lVar5 == lVar6) break;
        iDynTree::Traversal::getParentLinkFromLinkIndex((long)&this->pimpl->m_traversal);
        lVar6 = iDynTree::Link::getIndex();
        plVar7 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex
                                   ((long)&this->pimpl->m_traversal);
        lVar8 = (**(code **)(*plVar7 + 0xc0))(plVar7);
        for (uVar16 = 0; uVar4 = (**(code **)(*plVar7 + 0x20))(), uVar16 < uVar4;
            uVar16 = uVar16 + 1) {
          (**(code **)(*plVar7 + 0x60))
                    ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                      *)&jointMotionSubspace,plVar7,uVar16 & 0xffffffff,lVar5,lVar6);
          pDVar9 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                    *)&jointMotionSubspace;
          for (uVar11 = 0; uVar11 != 6; uVar11 = uVar11 + 1) {
            pDVar13 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                       *)(jointMotionSubspace.super_SpatialVector<iDynTree::SpatialMotionVector>.
                          angularVec3.super_Vector3.m_data + ((int)uVar11 - 3));
            if (uVar11 < 3) {
              pDVar13 = pDVar9;
            }
            *(ulong *)pDVar13 =
                 ~-(ulong)(ABS(*(double *)pDVar13) < DEFAULT_TOL) & 0x3ff0000000000000;
            pDVar9 = pDVar9 + 8;
          }
          toEigen(&local_1b8,&jointMotionSubspace);
          local_1d0[0] = &genericAdjointTransform;
          local_200.m_value = outJacobianPattern->m_cols;
          local_210 = (MatrixFixSize<6U,_6U> *)outJacobianPattern->m_storage;
          local_228._8_8_ = outJacobianPattern->m_rows;
          vStack_1f8.m_value = local_200.m_value;
          local_1f0.m_value = (long)peVar2;
          if (outJacobianPattern->m_storageOrder == ColumnMajor) {
            vStack_1f8.m_value = (long)peVar2;
            local_1f0.m_value = local_228._8_8_;
          }
          lVar1 = lVar8 + 6 + uVar16;
          local_228._0_8_ = (long)local_210 + local_1f0.m_value * lVar1 * 8;
          local_1e8.m_value = 0;
          local_208.m_value = local_228._8_8_;
          local_1e0.m_value = lVar1;
          local_1d8 = (pointer)local_1f0.m_value;
          local_1c0 = &local_1b8;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,_1,1,false>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                    ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>
                      *)local_228,
                     (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)local_1d0);
          for (peVar10 = (pointer)0x0; peVar10 < (pointer)outJacobianPattern->m_rows;
              peVar10 = (pointer)((long)peVar10 + 1)) {
            peVar12 = (pointer)outJacobianPattern->m_rows;
            peVar14 = peVar2;
            if (outJacobianPattern->m_storageOrder != ColumnMajor) {
              peVar14 = (pointer)outJacobianPattern->m_cols;
              peVar12 = peVar2;
            }
            outJacobianPattern->m_storage[(long)peVar12 * lVar1 + (long)peVar14 * (long)peVar10] =
                 (element_type)
                 (~-(ulong)(ABS(outJacobianPattern->m_storage
                                [(long)peVar12 * lVar1 + (long)peVar14 * (long)peVar10]) <
                           DEFAULT_TOL) & 0x3ff0000000000000);
          }
        }
      }
      return true;
    }
    pcVar17 = "getFrameFreeJacobianSparsityPattern";
    pcVar15 = "Wrong size in input outJacobianPattern";
  }
  iDynTree::reportError("KinDynComputations",pcVar17,pcVar15);
  return false;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern(const FrameIndex frameIndex,
                                                                         MatrixView<double> outJacobianPattern) const
    {
        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getFrameJacobian","Frame index out of bounds");
            return false;
        }

        bool ok = (outJacobianPattern.rows() == 6)
            && (outJacobianPattern.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

        if( !ok )
        {
            reportError("KinDynComputations",
                        "getFrameFreeJacobianSparsityPattern",
                        "Wrong size in input outJacobianPattern");
            return false;
        }

        // Get the link to which the frame is attached
        LinkIndex jacobLink = pimpl->m_robot_model.getFrameLink(frameIndex);

        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();

        // We zero the jacobian
        toEigen(outJacobianPattern).setZero();

        // Compute base part
        toEigen(outJacobianPattern).leftCols<6>() = toEigen(genericAdjointTransform);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobLink;

        while (visitedLinkIdx != pimpl->m_traversal.getBaseLink()->getIndex())
        {
            LinkIndex parentLinkIdx = pimpl->m_traversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = pimpl->m_traversal.getParentJointFromLinkIndex(visitedLinkIdx);

            size_t dofOffset = joint->getDOFsOffset();
            for (unsigned i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                SpatialMotionVector jointMotionSubspace = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                // 1 or 0 in vector
                for (size_t c = 0; c < jointMotionSubspace.size(); ++c) {
                    jointMotionSubspace(c) = std::abs(jointMotionSubspace(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobianPattern).col(6 + dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(jointMotionSubspace);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobianPattern).col(6 + dofOffset + i).size(); ++r) {
                    toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
            }

            visitedLinkIdx = parentLinkIdx;
        }

        return true;
    }